

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManDupWithConstrCollectAnd_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper,int fFirst)

{
  int Entry;
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  do {
    if (((ulong)pObj & 1) == 0) {
      uVar3 = *(ulong *)pObj;
      uVar1 = uVar3 & 0x1fffffff;
      if (fFirst == 0 && (uVar1 == 0x1fffffff || (int)uVar3 < 0)) goto LAB_001dd9cb;
    }
    else {
      if (fFirst == 0) {
LAB_001dd9cb:
        Entry = Gia_ObjToLit(p,pObj);
        Vec_IntPushUnique(vSuper,Entry);
        return;
      }
      uVar3 = *(ulong *)pObj;
      uVar1 = (ulong)((uint)uVar3 & 0x1fffffff);
    }
    fFirst = 0;
    Gia_ManDupWithConstrCollectAnd_rec
              (p,(Gia_Obj_t *)((ulong)((uint)(uVar3 >> 0x1d) & 1) ^ (ulong)(pObj + -uVar1)),vSuper,0
              );
    uVar2 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
    pObj = (Gia_Obj_t *)((ulong)(uVar2 >> 0x1d & 1) ^ (ulong)(pObj + -(ulong)(uVar2 & 0x1fffffff)));
  } while( true );
}

Assistant:

void Gia_ManDupWithConstrCollectAnd_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper, int fFirst )
{
    if ( (Gia_IsComplement(pObj) || !Gia_ObjIsAnd(pObj)) && !fFirst )
    {
        Vec_IntPushUnique( vSuper, Gia_ObjToLit(p, pObj) );
        return;
    }
    Gia_ManDupWithConstrCollectAnd_rec( p, Gia_ObjChild0(pObj), vSuper, 0 );
    Gia_ManDupWithConstrCollectAnd_rec( p, Gia_ObjChild1(pObj), vSuper, 0 );
}